

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_protocol.cc
# Opt level: O2

void __thiscall helix::nasdaq::itch50_protocol::itch50_protocol(itch50_protocol *this,string *name)

{
  (this->super_protocol)._vptr_protocol = (_func_int **)&PTR__itch50_protocol_00128ac8;
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  return;
}

Assistant:

itch50_protocol::itch50_protocol(std::string name)
    :_name{std::move(name)}
{
}